

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O3

string * __thiscall
boost::unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
          (string *__return_storage_ptr__,utils *this,basic_cstring<const_char> *t)

{
  ostringstream buff;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  undefined1 local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,*(undefined8 *)this,*(undefined8 *)(this + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,(char *)local_1a8,local_1a0);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

inline std::string
string_cast( T const& t )
{
    std::ostringstream buff;
    buff << t;
    return buff.str();
}